

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestBase.h
# Opt level: O0

void __thiscall TestQueue::TestQueue(TestQueue *this)

{
  TestQueue *pTVar1;
  TestQueue *this_local;
  
  this->_vptr_TestQueue = (_func_int **)&PTR__TestQueue_0050eb20;
  this->next = (TestQueue *)0x0;
  pTVar1 = this;
  if (head != (TestQueue *)0x0) {
    tail->next = this;
    pTVar1 = head;
  }
  head = pTVar1;
  tail = this;
  return;
}

Assistant:

TestQueue()
	{
		this->next = 0;
		if(!head)
		{
			head = tail = this;
		}else{
			tail->next = this;
			tail = this;
		}
	}